

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> * chrono::Qsub(ChQuaternion<double> *qa,ChQuaternion<double> *qb)

{
  ChQuaternion<double> *result;
  ChQuaternion<double> *in_RDI;
  
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  in_RDI->m_data[2] = 0.0;
  in_RDI->m_data[3] = 0.0;
  in_RDI->m_data[0] = qa->m_data[0] - qb->m_data[0];
  in_RDI->m_data[1] = qa->m_data[1] - qb->m_data[1];
  in_RDI->m_data[2] = qa->m_data[2] - qb->m_data[2];
  in_RDI->m_data[3] = qa->m_data[3] - qb->m_data[3];
  return in_RDI;
}

Assistant:

ChQuaternion<double> Qsub(const ChQuaternion<double>& qa, const ChQuaternion<double>& qb) {
    ChQuaternion<double> result;
    result.e0() = qa.e0() - qb.e0();
    result.e1() = qa.e1() - qb.e1();
    result.e2() = qa.e2() - qb.e2();
    result.e3() = qa.e3() - qb.e3();
    return result;
}